

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall QHttp2Connection::handleCONTINUATION(QHttp2Connection *this)

{
  QHttp2Connection *this_00;
  quint32 qVar1;
  quint32 qVar2;
  FrameFlags FVar3;
  char *message;
  
  if (*(long *)(this + 0x270) == *(long *)(this + 0x278)) {
    message = "CONTINUATION without a preceding HEADERS or PUSH_PROMISE";
  }
  else if (this[0x268] == (QHttp2Connection)0x0) {
    message = "CONTINUATION after a frame with the END_HEADERS flag set";
  }
  else {
    this_00 = this + 0x238;
    qVar1 = Http2::Frame::streamID((Frame *)this_00);
    if (*(Frame **)(this + 0x270) == *(Frame **)(this + 0x278)) {
      handleCONTINUATION();
    }
    qVar2 = Http2::Frame::streamID(*(Frame **)(this + 0x270));
    if (qVar1 == qVar2) {
      FVar3 = Http2::Frame::flags((Frame *)this_00);
      std::vector<Http2::Frame,_std::allocator<Http2::Frame>_>::emplace_back<Http2::Frame>
                ((vector<Http2::Frame,_std::allocator<Http2::Frame>_> *)(this + 0x270),
                 (Frame *)this_00);
      if (((uint)FVar3.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
                 super_QFlagsStorage<Http2::FrameFlag>.i & 4) == 0) {
        return;
      }
      this[0x268] = (QHttp2Connection)0x0;
      handleContinuedHEADERS(this);
      return;
    }
    message = "CONTINUATION on invalid stream";
  }
  connectionError(this,PROTOCOL_ERROR,message);
  return;
}

Assistant:

void QHttp2Connection::handleCONTINUATION()
{
    Q_ASSERT(inboundFrame.type() == FrameType::CONTINUATION);
    if (continuedFrames.empty())
        return connectionError(PROTOCOL_ERROR,
                               "CONTINUATION without a preceding HEADERS or PUSH_PROMISE");
    if (!continuationExpected)
        return connectionError(PROTOCOL_ERROR,
                               "CONTINUATION after a frame with the END_HEADERS flag set");

    if (inboundFrame.streamID() != continuedFrames.front().streamID())
        return connectionError(PROTOCOL_ERROR, "CONTINUATION on invalid stream");

    const bool endHeaders = inboundFrame.flags().testFlag(FrameFlag::END_HEADERS);
    continuedFrames.push_back(std::move(inboundFrame));

    if (!endHeaders)
        return;

    continuationExpected = false;
    handleContinuedHEADERS();
}